

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

CharClassBuilder * __thiscall re2::CharClassBuilder::Copy(CharClassBuilder *this)

{
  int l;
  bool bVar1;
  CharClassBuilder *this_00;
  pointer pRVar2;
  size_t in_stack_ffffffffffffffb0;
  RuneRange local_40;
  _Self local_38;
  _Self local_30;
  iterator it;
  CharClassBuilder *cc;
  CharClassBuilder *this_local;
  
  this_00 = (CharClassBuilder *)operator_new(in_stack_ffffffffffffffb0);
  CharClassBuilder(this_00);
  local_30._M_node = (_Base_ptr)begin(this);
  while( true ) {
    local_38._M_node = (_Base_ptr)end(this);
    bVar1 = std::operator==(&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pRVar2 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_30);
    l = pRVar2->lo;
    pRVar2 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_30);
    RuneRange::RuneRange(&local_40,l,pRVar2->hi);
    std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::insert
              (&this_00->ranges_,&local_40);
    std::_Rb_tree_const_iterator<re2::RuneRange>::operator++(&local_30);
  }
  this_00->upper_ = this->upper_;
  this_00->lower_ = this->lower_;
  this_00->nrunes_ = this->nrunes_;
  return this_00;
}

Assistant:

CharClassBuilder* CharClassBuilder::Copy() {
  CharClassBuilder* cc = new CharClassBuilder;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_.insert(RuneRange(it->lo, it->hi));
  cc->upper_ = upper_;
  cc->lower_ = lower_;
  cc->nrunes_ = nrunes_;
  return cc;
}